

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

Descriptor *
cfd::core::Descriptor::CreateDescriptor
          (Descriptor *__return_storage_ptr__,
          vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          *type_list,
          vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
          *key_info_list,uint32_t require_num,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  undefined8 *puVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  DescriptorScriptType DVar4;
  pointer pDVar5;
  bool bVar6;
  pointer pDVar7;
  Descriptor *pDVar8;
  char cVar9;
  char cVar10;
  long lVar11;
  undefined8 *puVar12;
  long *plVar13;
  CfdException *pCVar14;
  uint32_t uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  long *plVar17;
  pointer this;
  _Alloc_hider _Var18;
  ulong uVar19;
  string output_descriptor;
  string key_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> types;
  undefined1 local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [20];
  uint32_t local_10c;
  string local_108;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  pointer local_c8;
  ulong *local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  ulong local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *local_60;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_58;
  Descriptor *local_50;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> local_48
  ;
  
  local_10c = require_num;
  local_60 = key_info_list;
  if ((type_list->
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (type_list->
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_150._0_8_ = "cfdcore_descriptor.cpp";
    local_150._8_4_ = 0x806;
    local_140._M_allocated_capacity = 0x5d5e2c;
    logger::log<>((CfdSourceLocation *)local_150,kCfdLogLevelWarning,"Failed to type list.");
    pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
    local_150._0_8_ = &local_140;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"Failed to type list. list is empty.","");
    CfdException::CfdException(pCVar14,kCfdIllegalArgumentError,(string *)local_150);
    __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_150._0_8_ = &local_140;
  local_150._8_8_ = 0;
  local_140._M_allocated_capacity = local_140._M_allocated_capacity & 0xffffffffffffff00;
  local_58 = network_parameters;
  local_50 = __return_storage_ptr__;
  ::std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  vector(&local_48,type_list);
  if (local_48.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar3 = &local_108.field_2;
    do {
      local_130 = local_120;
      DVar4 = local_48.
              super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1];
      local_128 = 0;
      local_120[0] = 0;
      local_c8 = local_48.
                 super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_150._8_8_ == 0) {
        pDVar5 = (local_60->
                 super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (this = (local_60->
                    super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start; this != pDVar5; this = this + 1) {
          if (local_128 == 0) {
            DescriptorKeyInfo::ToString_abi_cxx11_((string *)local_170,this);
            ::std::__cxx11::string::operator=((string *)&local_130,(string *)local_170);
            _Var18._M_p = (pointer)local_170._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._0_8_ != &local_160) goto LAB_0031b062;
          }
          else {
            DescriptorKeyInfo::ToString_abi_cxx11_(&local_108,this);
            plVar13 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_108,0,(char *)0x0,0x5d5e2a);
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar13 == paVar16) {
              local_160._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_160._8_8_ = plVar13[3];
              local_170._0_8_ = &local_160;
            }
            else {
              local_160._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_170._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar13;
            }
            local_170._8_8_ = plVar13[1];
            *plVar13 = (long)paVar16;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)&local_130,local_170._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._0_8_ != &local_160) {
              operator_delete((void *)local_170._0_8_);
            }
            _Var18._M_p = local_108._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != paVar3) {
LAB_0031b062:
              operator_delete(_Var18._M_p);
            }
          }
        }
      }
      local_c8 = local_c8 + -1;
      lVar11 = 0;
      do {
        if (DVar4 == *(DescriptorScriptType *)((long)&DAT_0075a950 + lVar11)) {
          plVar13 = (long *)((long)&kDescriptorNodeScriptTable + lVar11);
          goto LAB_0031af0e;
        }
        lVar11 = lVar11 + 0x28;
      } while (lVar11 != 0x1b8);
      plVar13 = (long *)0x0;
LAB_0031af0e:
      if (DVar4 - kDescriptorScriptPk < 6) {
        if (local_150._8_8_ != 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x82a;
          local_160._M_allocated_capacity = 0x5d5e2c;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "key hash type is bottom only.");
          pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to createDescriptor. key hash type is bottom only."
                     ,"");
          CfdException::CfdException(pCVar14,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_128 == 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x830;
          local_160._M_allocated_capacity = 0x5d5e2c;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,"key list is empty");
          pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to createDescriptor. key list is empty.","");
          CfdException::CfdException(pCVar14,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if ((*(char *)((long)plVar13 + 0x26) == '\0') &&
           (1 < (ulong)(((long)(local_60->
                               super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_60->
                               super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5) * 0x4ec4ec4ec4ec4ec5
                       ))) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x836;
          local_160._M_allocated_capacity = 0x5d5e2c;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "multiple key is multisig only.");
          pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,
                     "Failed to createDescriptor. multiple key is multisig only.","");
          CfdException::CfdException(pCVar14,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
        }
LAB_0031b0ad:
        if (*(char *)((long)plVar13 + 0x26) != '\x01') {
          local_e8 = &local_d8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,*plVar13,plVar13[1] + *plVar13);
          ::std::__cxx11::string::append((char *)&local_e8);
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_130);
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 == paVar16) {
            local_108.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_108.field_2._8_8_ = puVar12[3];
            local_108._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_108.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_108._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_108._M_string_length = puVar12[1];
          *puVar12 = paVar16;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_108);
          goto LAB_0031b1ef;
        }
        local_a0 = local_90;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,*plVar13,plVar13[1] + *plVar13);
        ::std::__cxx11::string::append((char *)&local_a0);
        cVar10 = '\x01';
        if (9 < local_10c) {
          uVar15 = local_10c;
          cVar9 = '\x04';
          do {
            cVar10 = cVar9;
            if (uVar15 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_0031b2fb;
            }
            if (uVar15 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_0031b2fb;
            }
            if (uVar15 < 10000) goto LAB_0031b2fb;
            bVar6 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            cVar9 = cVar10 + '\x04';
          } while (bVar6);
          cVar10 = cVar10 + '\x01';
        }
LAB_0031b2fb:
        local_c0 = local_b0;
        ::std::__cxx11::string::_M_construct((ulong)&local_c0,cVar10);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c0,local_b8,local_10c);
        uVar19 = 0xf;
        if (local_a0 != local_90) {
          uVar19 = local_90[0];
        }
        uVar2 = CONCAT44(uStack_b4,local_b8) + local_98;
        if (uVar19 < uVar2) {
          uVar19 = 0xf;
          if (local_c0 != local_b0) {
            uVar19 = local_b0[0];
          }
          if (uVar19 < uVar2) goto LAB_0031b396;
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
        }
        else {
LAB_0031b396:
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0);
        }
        puVar1 = puVar12 + 2;
        if ((undefined8 *)*puVar12 == puVar1) {
          local_70 = *puVar1;
          uStack_68 = puVar12[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *puVar1;
          local_80 = (undefined8 *)*puVar12;
        }
        local_78 = puVar12[1];
        *puVar12 = puVar1;
        puVar12[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar13 = (long *)::std::__cxx11::string::append((char *)&local_80);
        plVar17 = plVar13 + 2;
        if ((long *)*plVar13 == plVar17) {
          local_d8 = *plVar17;
          lStack_d0 = plVar13[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar17;
          local_e8 = (long *)*plVar13;
        }
        local_e0 = plVar13[1];
        *plVar13 = (long)plVar17;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        puVar12 = (undefined8 *)
                  ::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_130);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 == paVar16) {
          local_108.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_108.field_2._8_8_ = puVar12[3];
          local_108._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_108.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_108._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_108._M_string_length = puVar12[1];
        *puVar12 = paVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_108);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 == paVar16) {
          local_160._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_160._8_8_ = puVar12[3];
          local_170._0_8_ = &local_160;
        }
        else {
          local_160._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar12;
        }
        local_170._8_8_ = puVar12[1];
        *puVar12 = paVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_150,(string *)local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ != &local_160) {
          operator_delete((void *)local_170._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar3) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        pDVar7 = local_c8;
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0);
        }
        local_48.
        super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar7;
        if (local_a0 != local_90) {
          operator_delete(local_a0);
        }
      }
      else {
        if (1 < DVar4 - kDescriptorScriptSh) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x849;
          local_160._M_allocated_capacity = 0x5d5e2c;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,"Failed to script type.")
          ;
          pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to script type. this type is unsupported.","");
          CfdException::CfdException(pCVar14,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_150._8_8_ == 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x83f;
          local_160._M_allocated_capacity = 0x5d5e2c;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "Failed to script hash type.");
          pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,
                     "Failed to script hash type. this type is unsupported of key.","");
          CfdException::CfdException(pCVar14,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_128 != 0) goto LAB_0031b0ad;
        local_e8 = &local_d8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,*plVar13,plVar13[1] + *plVar13);
        ::std::__cxx11::string::append((char *)&local_e8);
        puVar12 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_e8,local_150._0_8_)
        ;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 == paVar16) {
          local_108.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_108.field_2._8_8_ = puVar12[3];
          local_108._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_108.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_108._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_108._M_string_length = puVar12[1];
        *puVar12 = paVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_108);
LAB_0031b1ef:
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 == paVar16) {
          local_160._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_160._8_8_ = puVar12[3];
          local_170._0_8_ = &local_160;
        }
        else {
          local_160._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar12;
        }
        local_170._8_8_ = puVar12[1];
        *puVar12 = paVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_150,(string *)local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ != &local_160) {
          operator_delete((void *)local_170._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar3) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        local_48.
        super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
        ._M_impl.super__Vector_impl_data._M_finish = local_c8;
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
          local_48.
          super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          ._M_impl.super__Vector_impl_data._M_finish = local_c8;
        }
      }
      if (local_130 != local_120) {
        operator_delete(local_130);
      }
    } while (local_48.
             super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_48.
             super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  pDVar8 = local_50;
  Parse(local_50,(string *)local_150,local_58);
  if (local_48.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._0_8_ != &local_140) {
    operator_delete((void *)local_150._0_8_);
  }
  return pDVar8;
}

Assistant:

Descriptor Descriptor::CreateDescriptor(
    const std::vector<DescriptorScriptType>& type_list,
    const std::vector<DescriptorKeyInfo>& key_info_list, uint32_t require_num,
    const std::vector<AddressFormatData>* network_parameters) {
  if (type_list.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to type list.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to type list. list is empty.");
  }
  std::string output_descriptor;
  std::vector<DescriptorScriptType> types(type_list);
  for (auto ite = types.rbegin(); ite != types.rend(); ++ite) {
    DescriptorScriptType type = *ite;

    std::string key_text;
    if (output_descriptor.empty() && (!key_info_list.empty())) {
      for (const auto& key_info : key_info_list) {
        if (key_text.empty()) {
          key_text = key_info.ToString();
        } else {
          key_text += "," + key_info.ToString();
        }
      }
    }

    const DescriptorNodeScriptData* p_data = nullptr;
    for (const auto& node_data : kDescriptorNodeScriptTable) {
      if (type == node_data.type) {
        p_data = &node_data;
        break;
      }
    }
    switch (type) {
      case DescriptorScriptType::kDescriptorScriptPk:
      case DescriptorScriptType::kDescriptorScriptPkh:
      case DescriptorScriptType::kDescriptorScriptWpkh:
      case DescriptorScriptType::kDescriptorScriptCombo:
      case DescriptorScriptType::kDescriptorScriptMulti:
      case DescriptorScriptType::kDescriptorScriptSortedMulti:
        if (!output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "key hash type is bottom only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key hash type is bottom only.");
        }
        if (key_text.empty()) {
          warn(CFD_LOG_SOURCE, "key list is empty");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key list is empty.");
        }
        if ((!p_data->multisig) && (key_info_list.size() > 1)) {
          warn(CFD_LOG_SOURCE, "multiple key is multisig only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. multiple key is multisig only.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptSh:
      case DescriptorScriptType::kDescriptorScriptWsh:
        if (output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "Failed to script hash type.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to script hash type. this type is unsupported of key.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptNull:
      case DescriptorScriptType::kDescriptorScriptAddr:
      case DescriptorScriptType::kDescriptorScriptRaw:
      default:
        warn(CFD_LOG_SOURCE, "Failed to script type.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to script type. this type is unsupported.");
        break;
    }

    if (key_text.empty()) {
      output_descriptor = p_data->name + "(" + output_descriptor + ")";
    } else if (p_data->multisig) {
      output_descriptor = p_data->name + "(" + std::to_string(require_num) +
                          "," + key_text + ")";
    } else {
      output_descriptor = p_data->name + "(" + key_text + ")";
    }
  }

  // Check descriptor script format.
  return Parse(output_descriptor, network_parameters);
}